

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_session_read(nh_session_t *session)

{
  http_context_t *ctx;
  int iVar1;
  
  session->state = SESSION_READ;
  session->timeout = session->server->timeout;
  iVar1 = nh_read_socket(&(session->context).raw,session->socket);
  if (iVar1 == 0) {
    session->state = SESSION_END;
  }
  else {
    ctx = &session->context;
    iVar1 = nh_http_parse(ctx);
    if ((session->context).parse_state == PARSE_DONE) {
      if (iVar1 == 0) {
        (session->context).response.status = 400;
        (session->context).response.body.value = "Bad Request";
        (session->context).response.body.len = 0xb;
      }
      else {
        (*session->server->request_handler)(ctx);
        if ((session->flags & 4) != 0) {
          return;
        }
        nh_keep_alive_handler(ctx);
      }
      nh_stream_init(&(session->context).response.raw);
      nh_generate_http_response(ctx);
      nh_session_write(session);
      return;
    }
  }
  return;
}

Assistant:

void nh_session_read(nh_session_t *session) {
    session->state = SESSION_READ;
    session->timeout = session->server->timeout;
    if (nh_read_socket(&session->context.raw, session->socket) == 0) {
        session->state = SESSION_END;
        return;
    }

    int result = nh_http_parse(&session->context);
    if (session->context.parse_state != PARSE_DONE) return;
    if (result) {
        // success, process
        session->server->request_handler(&session->context);

#ifndef DISABLE_WEBSOCKET
        if (FLAG_CHECK(session->flags, SESSION_FLAG_UPGRADED)) return;
#endif

        nh_keep_alive_handler(&session->context);
    } else {
        // fail, report error
        set_response_status(&session->context, 400);
        set_response_body(&session->context, "Bad Request");
    }
    nh_stream_init(&session->context.response.raw);
    nh_generate_http_response(&session->context);
    nh_session_write(session);
}